

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

int Bstrlib::getUnicodeCharCount(uchar *array)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  bVar1 = *array;
  iVar2 = 0;
  if (-1 < (char)bVar1) {
    return (int)(bVar1 != 0);
  }
  if ((bVar1 & 0x40) != 0) {
    uVar3 = 0x40;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + 1;
      uVar3 = uVar3 >> 1;
    } while ((uVar3 & bVar1) != 0);
  }
  return iVar2;
}

Assistant:

int getUnicodeCharCount(const unsigned char * array)
    {
        const uint8 c = *array;
        if ((c & 0x80))
        {
            // The count bit mask
            uint32 bitCountMask = 0x40;
            // The consumption count
            int charCount = 0;

            while ((c & bitCountMask) != 0 && bitCountMask)
            {
                ++charCount;
                bitCountMask >>= 1;
            }
            return charCount;
        }
        return c == 0 ? 0 : 1;
    }